

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

U32 ZSTD_btGetAllMatches_noDict_6
              (ZSTD_match_t *matches,ZSTD_matchState_t *ms,U32 *nextToUpdate3,BYTE *ip,
              BYTE *iHighLimit,U32 *rep,U32 ll0,U32 lengthToBeat)

{
  ulong *puVar1;
  ulong *puVar2;
  uint uVar3;
  uint uVar4;
  U32 *pUVar5;
  long lVar6;
  U32 UVar7;
  int iVar8;
  ulong uVar9;
  ulong *puVar10;
  uint *puVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  uint *puVar16;
  ulong *puVar17;
  BYTE *pBVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  uint uVar26;
  long lVar27;
  uint uVar28;
  ulong uVar29;
  BYTE *pInLoopLimit;
  uint local_d4;
  ulong local_d0;
  uint *local_b0;
  uint local_74;
  BYTE *local_70;
  ZSTD_matchState_t *local_68;
  BYTE *local_60;
  ulong *local_58;
  ulong *local_50;
  ZSTD_match_t *local_48;
  BYTE *local_40;
  U32 *local_38;
  
  local_48 = matches;
  if ((ms->cParams).minMatch < 6) {
    __assert_fail("BOUNDED(3, ms->cParams.minMatch, 6) == mls",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x8263,
                  "U32 ZSTD_btGetAllMatches_internal(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *, const BYTE *const, const U32 *, const U32, const U32, const ZSTD_dictMode_e, const U32)"
                 );
  }
  pBVar18 = (ms->window).base;
  uVar25 = (ulong)ms->nextToUpdate;
  UVar7 = 0;
  if (pBVar18 + uVar25 <= ip) {
    local_68 = ms;
    while( true ) {
      uVar28 = (uint)uVar25;
      uVar13 = (uint)((long)ip - (long)pBVar18);
      if (uVar13 <= uVar28) break;
      UVar7 = ZSTD_insertBt1(ms,pBVar18 + uVar25,iHighLimit,uVar13,6,0);
      uVar25 = (ulong)(UVar7 + uVar28);
      if (UVar7 + uVar28 <= uVar28) {
        __assert_fail("idx < (U32)(idx + forward)",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x815a,
                      "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                     );
      }
    }
    if ((ulong)((long)ip - (long)pBVar18) >> 0x20 != 0) {
      __assert_fail("(size_t)(ip - base) <= (size_t)(U32)(-1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x815d,
                    "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                   );
    }
    if ((ulong)((long)iHighLimit - (long)pBVar18) >> 0x20 != 0) {
      __assert_fail("(size_t)(iend - base) <= (size_t)(U32)(-1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x815e,
                    "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                   );
    }
    ms->nextToUpdate = uVar13;
    uVar13 = (ms->cParams).targetLength;
    uVar28 = 0xfff;
    if (uVar13 < 0xfff) {
      uVar28 = uVar13;
    }
    uVar13 = (ms->cParams).hashLog;
    if (0x20 < uVar13) {
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
    }
    local_60 = (ms->window).base;
    uVar26 = (int)ip - (int)local_60;
    uVar29 = (ulong)(*(long *)ip * -0x30e4432340650000) >> (-(char)uVar13 & 0x3fU);
    uVar21 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
    uVar13 = (ms->window).lowLimit;
    uVar25 = 0;
    uVar12 = uVar26 - uVar21;
    if (uVar26 < uVar21) {
      uVar12 = 0;
    }
    uVar20 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    uVar19 = uVar26 - uVar20;
    if (uVar26 - uVar13 <= uVar20) {
      uVar19 = uVar13;
    }
    if (ms->loadedDictEnd != 0) {
      uVar19 = uVar13;
    }
    uVar13 = uVar19 + (uVar19 == 0);
    uVar20 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
    if (1 < ll0) {
      __assert_fail("ll0 <= 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x819e,
                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                   );
    }
    pUVar5 = ms->hashTable;
    uVar3 = pUVar5[uVar29];
    local_38 = ms->chainTable;
    uVar4 = (ms->window).dictLimit;
    uVar22 = (ulong)((uVar21 & uVar26) * 2);
    local_b0 = local_38 + uVar22;
    puVar16 = local_38 + uVar22 + 1;
    local_d4 = uVar26 + 9;
    local_d0 = (ulong)(lengthToBeat - 1);
    puVar1 = (ulong *)(ip + 4);
    puVar2 = (ulong *)(iHighLimit + -7);
    local_50 = (ulong *)(iHighLimit + -3);
    local_58 = (ulong *)(iHighLimit + -1);
    uVar22 = (ulong)ll0;
    do {
      if (uVar22 == 3) {
        uVar14 = *rep - 1;
      }
      else {
        uVar14 = rep[uVar22];
      }
      if (uVar26 < uVar4) {
        __assert_fail("curr >= dictLimit",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x81a5,
                      "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                     );
      }
      if (uVar14 - 1 < uVar26 - uVar4) {
        uVar24 = 0;
        if ((uVar19 <= uVar26 - uVar14) && (*(int *)ip == *(int *)(ip + -(ulong)uVar14))) {
          lVar27 = -(ulong)uVar14;
          puVar17 = (ulong *)((long)puVar1 + lVar27);
          puVar10 = puVar1;
          if (puVar1 < puVar2) {
            if (*puVar17 == *puVar1) {
              lVar27 = lVar27 + 0xc;
              lVar15 = 0;
              do {
                puVar10 = (ulong *)(ip + lVar15 + 0xc);
                if (puVar2 <= puVar10) {
                  puVar17 = (ulong *)(ip + lVar15 + lVar27);
                  goto LAB_001cbe47;
                }
                lVar6 = lVar15 + lVar27;
                lVar15 = lVar15 + 8;
              } while (*(ulong *)(ip + lVar6) == *puVar10);
              uVar23 = *puVar10 ^ *(ulong *)(ip + lVar6);
              uVar24 = 0;
              if (uVar23 != 0) {
                for (; (uVar23 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
                }
              }
              uVar14 = ((uint)(uVar24 >> 3) & 0x1fffffff) + (int)lVar15;
            }
            else {
              uVar23 = *puVar1 ^ *puVar17;
              uVar24 = 0;
              if (uVar23 != 0) {
                for (; (uVar23 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
                }
              }
              uVar14 = (uint)(uVar24 >> 3) & 0x1fffffff;
            }
          }
          else {
LAB_001cbe47:
            if ((puVar10 < local_50) && ((int)*puVar17 == (int)*puVar10)) {
              puVar10 = (ulong *)((long)puVar10 + 4);
              puVar17 = (ulong *)((long)puVar17 + 4);
            }
            if ((puVar10 < local_58) && ((short)*puVar17 == (short)*puVar10)) {
              puVar10 = (ulong *)((long)puVar10 + 2);
              puVar17 = (ulong *)((long)puVar17 + 2);
            }
            if (puVar10 < iHighLimit) {
              puVar10 = (ulong *)((long)puVar10 + (ulong)((char)*puVar17 == (char)*puVar10));
            }
            uVar14 = (int)puVar10 - (int)puVar1;
          }
          uVar24 = (ulong)(uVar14 + 4);
        }
      }
      else {
        uVar24 = 0;
        if (uVar26 < uVar19) {
          __assert_fail("curr >= windowLow",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x81b1,
                        "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                       );
        }
      }
      if (local_d0 < uVar24) {
        local_48[uVar25].off = ((int)uVar22 - ll0) + 1;
        local_48[uVar25].len = (uint)uVar24;
        uVar14 = (int)uVar25 + 1;
        uVar25 = (ulong)uVar14;
        if (uVar28 < (uint)uVar24) {
          return uVar14;
        }
        local_d0 = uVar24;
        if (ip + uVar24 == iHighLimit) {
          return uVar14;
        }
      }
      uVar22 = uVar22 + 1;
    } while (ll0 + 3 != (int)uVar22);
    pUVar5[uVar29] = uVar26;
    if (uVar13 <= uVar3) {
      local_70 = local_60 + 8;
      local_40 = ip + 8;
      uVar22 = 0;
      uVar29 = 0;
      do {
        uVar24 = uVar29;
        if (uVar22 < uVar29) {
          uVar24 = uVar22;
        }
        if (uVar26 <= uVar3) {
          __assert_fail("curr > matchIndex",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x81f1,
                        "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                       );
        }
        uVar23 = uVar24 + uVar3;
        if (uVar23 < uVar4) {
          __assert_fail("matchIndex+matchLength >= dictLimit",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x81f4,
                        "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                       );
        }
        pBVar18 = local_60 + uVar3;
        if ((uVar4 <= uVar3) && (iVar8 = bcmp(pBVar18,ip,uVar24), iVar8 != 0)) {
          __assert_fail("memcmp(match, ip, matchLength) == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x81f6,
                        "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                       );
        }
        puVar1 = (ulong *)(ip + uVar24);
        puVar17 = (ulong *)(pBVar18 + uVar24);
        puVar10 = puVar1;
        if (puVar1 < puVar2) {
          if (*puVar17 == *puVar1) {
            lVar27 = 0;
            do {
              puVar10 = (ulong *)(local_40 + lVar27 + uVar24);
              if (puVar2 <= puVar10) {
                puVar17 = (ulong *)(local_70 + uVar23 + lVar27);
                goto LAB_001cc0ae;
              }
              lVar15 = lVar27 + uVar23;
              lVar27 = lVar27 + 8;
            } while (*(ulong *)(local_70 + lVar15) == *puVar10);
            uVar9 = *puVar10 ^ *(ulong *)(local_70 + lVar15);
            uVar23 = 0;
            if (uVar9 != 0) {
              for (; (uVar9 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
              }
            }
            uVar23 = (uVar23 >> 3 & 0x1fffffff) + lVar27;
          }
          else {
            uVar9 = *puVar1 ^ *puVar17;
            uVar23 = 0;
            if (uVar9 != 0) {
              for (; (uVar9 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
              }
            }
            uVar23 = uVar23 >> 3 & 0x1fffffff;
          }
        }
        else {
LAB_001cc0ae:
          if ((puVar10 < local_50) && ((int)*puVar17 == (int)*puVar10)) {
            puVar10 = (ulong *)((long)puVar10 + 4);
            puVar17 = (ulong *)((long)puVar17 + 4);
          }
          if ((puVar10 < local_58) && ((short)*puVar17 == (short)*puVar10)) {
            puVar10 = (ulong *)((long)puVar10 + 2);
            puVar17 = (ulong *)((long)puVar17 + 2);
          }
          if (puVar10 < iHighLimit) {
            puVar10 = (ulong *)((long)puVar10 + (ulong)((char)*puVar17 == (char)*puVar10));
          }
          uVar23 = (long)puVar10 - (long)puVar1;
        }
        uVar23 = uVar23 + uVar24;
        if (local_d0 < uVar23) {
          if (local_d4 < uVar3 || local_d4 - uVar3 == 0) {
            __assert_fail("matchEndIdx > matchIndex",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x8203,
                          "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                         );
          }
          if (local_d4 - uVar3 < uVar23) {
            local_d4 = uVar3 + (U32)uVar23;
          }
          local_48[uVar25].off = (uVar26 + 3) - uVar3;
          local_48[uVar25].len = (U32)uVar23;
          uVar25 = (ulong)((int)uVar25 + 1);
          if ((0x1000 < uVar23) || (local_d0 = uVar23, ip + uVar23 == iHighLimit)) break;
        }
        puVar11 = local_38 + (uVar3 & uVar21) * 2;
        if (pBVar18[uVar23] < ip[uVar23]) {
          *local_b0 = uVar3;
          if (uVar3 <= uVar12) {
            local_b0 = &local_74;
            break;
          }
          puVar11 = puVar11 + 1;
          uVar22 = uVar23;
          local_b0 = puVar11;
        }
        else {
          *puVar16 = uVar3;
          puVar16 = puVar11;
          uVar29 = uVar23;
          if (uVar3 <= uVar12) {
            puVar16 = &local_74;
            break;
          }
        }
        uVar20 = uVar20 - 1;
        if ((uVar20 == 0) || (uVar3 = *puVar11, uVar3 < uVar13)) break;
      } while( true );
    }
    UVar7 = (U32)uVar25;
    *puVar16 = 0;
    *local_b0 = 0;
    if (0x40000000 < uVar20) {
      __assert_fail("nbCompares <= (1U << ZSTD_SEARCHLOG_MAX)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8221,
                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                   );
    }
    if (local_d4 <= uVar26 + 8) {
      __assert_fail("matchEndIdx > curr+8",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x8248,
                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                   );
    }
    local_68->nextToUpdate = local_d4 - 8;
  }
  return UVar7;
}

Assistant:

GEN_ZSTD_BT_GET_ALL_MATCHES(noDict)
GEN_ZSTD_BT_GET_ALL_MATCHES(extDict)
GEN_ZSTD_BT_GET_ALL_MATCHES(dictMatchState)

#define ZSTD_BT_GET_ALL_MATCHES_ARRAY(dictMode)  \
    {                                            \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 3), \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 4), \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 5), \
        ZSTD_BT_GET_ALL_MATCHES_FN(dictMode, 6)  \
    }

static ZSTD_getAllMatchesFn
ZSTD_selectBtGetAllMatches(ZSTD_matchState_t const* ms, ZSTD_dictMode_e const dictMode)
{
    ZSTD_getAllMatchesFn const getAllMatchesFns[3][4] = {
        ZSTD_BT_GET_ALL_MATCHES_ARRAY(noDict),
        ZSTD_BT_GET_ALL_MATCHES_ARRAY(extDict),
        ZSTD_BT_GET_ALL_MATCHES_ARRAY(dictMatchState)
    };
    U32 const mls = BOUNDED(3, ms->cParams.minMatch, 6);
    assert((U32)dictMode < 3);
    assert(mls - 3 < 4);
    return getAllMatchesFns[(int)dictMode][mls - 3];
}

/*************************
*  LDM helper functions  *
*************************/

/* Struct containing info needed to make decision about ldm inclusion */
typedef struct {
    rawSeqStore_t seqStore;   /* External match candidates store for this block */
    U32 startPosInBlock;      /* Start position of the current match candidate */
    U32 endPosInBlock;        /* End position of the current match candidate */
    U32 offset;               /* Offset of the match candidate */
} ZSTD_optLdm_t;

/* ZSTD_optLdm_skipRawSeqStoreBytes():
 * Moves forward in @rawSeqStore by @nbBytes,
 * which will update the fields 'pos' and 'posInSequence'.
 */
static void ZSTD_optLdm_skipRawSeqStoreBytes(rawSeqStore_t* rawSeqStore, size_t nbBytes)
{
    U32 currPos = (U32)(rawSeqStore->posInSequence + nbBytes);
    while (currPos && rawSeqStore->pos < rawSeqStore->size) {
        rawSeq currSeq = rawSeqStore->seq[rawSeqStore->pos];
        if (currPos >= currSeq.litLength + currSeq.matchLength) {
            currPos -= currSeq.litLength + currSeq.matchLength;
            rawSeqStore->pos++;
        } else {
            rawSeqStore->posInSequence = currPos;
            break;
        }
    }
    if (currPos == 0 || rawSeqStore->pos == rawSeqStore->size) {
        rawSeqStore->posInSequence = 0;
    }
}